

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_bench.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *col;
  pointer pbVar4;
  CSVFileInfo info;
  string filename;
  
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename,argv[1],(allocator<char> *)&info);
    lVar1 = std::chrono::_V2::system_clock::now();
    csv::get_file_info(&info,&filename);
    lVar2 = std::chrono::_V2::system_clock::now();
    std::operator<<((ostream *)&std::cout,"Parsing took (including disk IO): ");
    poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) / 1000000000.0);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Dimensions: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," rows x ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," columns ");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)&std::cout,"Columns: ");
    for (pbVar4 = info.col_names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 != info.col_names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      poVar3 = std::operator<<((ostream *)&std::cout," ");
      std::operator<<(poVar3,(string *)pbVar4);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    csv::CSVFileInfo::~CSVFileInfo(&info);
    std::__cxx11::string::~string((string *)&filename);
    return 0;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar3 = std::operator<<(poVar3,*argv);
  poVar3 = std::operator<<(poVar3," [file]");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
    using namespace csv;

    if (argc < 2) {
        std::cout << "Usage: " << argv[0] << " [file]" << std::endl;
        exit(1);
    }

    // Benchmark 1: File IO + Parsing
    std::string filename = argv[1];
    auto start = std::chrono::system_clock::now();
    auto info = get_file_info(filename);
    auto end = std::chrono::system_clock::now();
    std::chrono::duration<double> diff = end - start;

    std::cout << "Parsing took (including disk IO): " << diff.count() << std::endl;
    std::cout << "Dimensions: " << info.n_rows << " rows x " << info.n_cols << " columns " << std::endl;
    std::cout << "Columns: ";
    for (auto& col : info.col_names) {
        std::cout << " " << col;
    }
    std::cout << std::endl;

    // Benchmark 2: Parsing Only
    /*
    std::ifstream csv(filename);
    std::stringstream buffer;
    buffer << csv.rdbuf();

    auto csv_str = buffer.str();

    start = std::chrono::system_clock::now();
    parse(csv_str);
    end = std::chrono::system_clock::now();
    diff = end - start;

    std::cout << "Parsing took: " << diff.count() << std::endl;
    */

    return 0;
}